

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::_::
concat<kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>>
          (String *__return_storage_ptr__,_ *this,FixedArray<char,_1UL> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          CappedArray<char,_8UL> *params_3)

{
  size_t sVar1;
  long lVar2;
  size_t size;
  _ *p_Var3;
  long local_50 [3];
  char *local_38;
  
  local_50[0] = 1;
  local_50[1] = *(undefined8 *)(params + 8);
  local_50[2] = params_1->size_;
  local_38 = params_2->ptr;
  size = 0;
  lVar2 = 0;
  do {
    size = size + *(long *)((long)local_50 + lVar2);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  heapString(__return_storage_ptr__,size);
  p_Var3 = (_ *)(__return_storage_ptr__->content).size_;
  if (p_Var3 != (_ *)0x0) {
    p_Var3 = (_ *)(__return_storage_ptr__->content).ptr;
  }
  *p_Var3 = *this;
  p_Var3 = p_Var3 + 1;
  sVar1 = *(size_t *)(params + 8);
  if (sVar1 != 0) {
    memcpy(p_Var3,*(void **)params,sVar1);
    p_Var3 = p_Var3 + sVar1;
  }
  sVar1 = params_1->size_;
  if (sVar1 != 0) {
    memcpy(p_Var3,params_1->ptr,sVar1);
    p_Var3 = p_Var3 + sVar1;
  }
  if (params_2->ptr != (char *)0x0) {
    memcpy(p_Var3,&params_2->size_,(size_t)params_2->ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}